

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string * el::base::utils::File::extractPathFromFilename
                   (string *__return_storage_ptr__,string *fullPath,char *separator)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  allocator local_19;
  
  iVar2 = ::std::__cxx11::string::compare((char *)fullPath);
  if (iVar2 != 0) {
    strlen(separator);
    lVar3 = ::std::__cxx11::string::find((char *)fullPath,(ulong)separator,0);
    if (lVar3 != -1) {
      strlen(separator);
      lVar3 = ::std::__cxx11::string::find_last_of
                        ((char *)fullPath,(ulong)separator,0xffffffffffffffff);
      if (lVar3 != 0) {
        ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)fullPath);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,separator,&local_19);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (fullPath->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + fullPath->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string File::extractPathFromFilename(const std::string& fullPath, const char* separator) {
  if ((fullPath == "") || (fullPath.find(separator) == std::string::npos)) {
    return fullPath;
  }
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  if (lastSlashAt == 0) {
    return std::string(separator);
  }
  return fullPath.substr(0, lastSlashAt + 1);
}